

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setData
          (Texture *this,ConstPixelBufferAccess *src,int width,int height,deUint32 internalFormat,
          bool useMipmap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 target;
  TextureFormat *this_00;
  TransferFormat TVar4;
  void *pvVar5;
  int local_6c;
  CubeFace local_5c;
  int face;
  int levelHei_1;
  int levelWid_1;
  int level_1;
  int levelHei;
  int levelWid;
  int level;
  GLenum local_38;
  GLenum GStack_34;
  TransferFormat transfer;
  TextureFormat *format;
  bool useMipmap_local;
  deUint32 internalFormat_local;
  int height_local;
  int width_local;
  ConstPixelBufferAccess *src_local;
  Texture *this_local;
  
  this_00 = tcu::ConstPixelBufferAccess::getFormat(src);
  TVar4 = glu::getTransferFormat(*this_00);
  if (useMipmap) {
    iVar1 = de::max<int>(width,height);
    local_6c = deLog2Floor32(iVar1);
    local_6c = local_6c + 1;
  }
  else {
    local_6c = 1;
  }
  this->m_numMipLevels = local_6c;
  this->m_internalFormat = internalFormat;
  iVar1 = tcu::TextureFormat::getPixelSize(this_00);
  iVar2 = 1;
  if (this->m_type == TEXTURETYPE_CUBE) {
    iVar2 = 6;
  }
  this->m_dataSizeApprox = width * height * iVar1 * iVar2;
  iVar1 = computePixelStore(this_00);
  glwPixelStorei(0xcf5,iVar1);
  local_38 = TVar4.format;
  GStack_34 = TVar4.dataType;
  if (this->m_type == TEXTURETYPE_2D) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0xde1,this->m_textureGL);
    for (levelHei = 0; levelHei < this->m_numMipLevels; levelHei = levelHei + 1) {
      iVar1 = de::max<int>(1,width >> ((byte)levelHei & 0x1f));
      iVar2 = de::max<int>(1,height >> ((byte)levelHei & 0x1f));
      iVar3 = tcu::TextureFormat::getPixelSize(this_00);
      this->m_dataSizeApprox = iVar1 * iVar2 * iVar3 + this->m_dataSizeApprox;
      pvVar5 = tcu::ConstPixelBufferAccess::getDataPtr(src);
      glwTexImage2D(0xde1,levelHei,internalFormat,iVar1,iVar2,0,local_38,GStack_34,pvVar5);
    }
  }
  else if (this->m_type == TEXTURETYPE_CUBE) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0x8513,this->m_textureGL);
    for (levelHei_1 = 0; levelHei_1 < this->m_numMipLevels; levelHei_1 = levelHei_1 + 1) {
      iVar1 = de::max<int>(1,width >> ((byte)levelHei_1 & 0x1f));
      iVar2 = de::max<int>(1,height >> ((byte)levelHei_1 & 0x1f));
      iVar3 = tcu::TextureFormat::getPixelSize(this_00);
      this->m_dataSizeApprox = iVar1 * 6 * iVar2 * iVar3 + this->m_dataSizeApprox;
      for (local_5c = CUBEFACE_NEGATIVE_X; (int)local_5c < 6;
          local_5c = local_5c + CUBEFACE_POSITIVE_X) {
        target = cubeFaceToGLFace(local_5c);
        pvVar5 = tcu::ConstPixelBufferAccess::getDataPtr(src);
        glwTexImage2D(target,levelHei_1,internalFormat,iVar1,iVar2,0,local_38,GStack_34,pvVar5);
      }
    }
  }
  return;
}

Assistant:

void Texture::setData (const ConstPixelBufferAccess& src, const int width, const int height, const deUint32 internalFormat, const bool useMipmap)
{
	DE_ASSERT(m_type != TEXTURETYPE_CUBE || width == height);
	DE_ASSERT(!useMipmap || (deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height)));

	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	m_numMipLevels = useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;

	m_internalFormat = internalFormat;
	m_dataSizeApprox = width * height * format.getPixelSize() * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += levelWid * levelHei * format.getPixelSize();
			glTexImage2D(GL_TEXTURE_2D, level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += 6 * levelWid * levelHei * format.getPixelSize();
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexImage2D(cubeFaceToGLFace((CubeFace)face), level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}